

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_indset.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::find_indset
          (Omega_h *this,Mesh *mesh,Int ent_dim,Graph *graph,Reals *quality,
          Read<signed_char> *candidates)

{
  int *piVar1;
  void *pvVar2;
  Alloc *pAVar3;
  Alloc *this_00;
  Alloc *this_01;
  Alloc *this_02;
  Alloc *this_03;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Read<signed_char> RVar10;
  LOs adj;
  LOs xadj;
  Read<signed_char> local_e0;
  LOs local_d0;
  LOs local_c0;
  QualityCompare local_b0;
  void *local_90;
  Mesh *local_88;
  Alloc *local_80;
  void *local_78;
  Alloc *local_70;
  element_type *peStack_68;
  Alloc *local_60;
  void *local_58;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  element_type *local_38;
  void *pvVar4;
  
  local_50 = (graph->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  this_03 = local_50;
  pvVar4 = (graph->a2ab).write_.shared_alloc_.direct_ptr;
  local_60 = (graph->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60 = (Alloc *)(local_60->size * 8 + 1);
    }
    else {
      local_60->use_count = local_60->use_count + 1;
    }
  }
  this_02 = local_60;
  pvVar2 = (graph->ab2b).write_.shared_alloc_.direct_ptr;
  local_70 = (Alloc *)0x0;
  peStack_68 = (element_type *)0x0;
  local_80 = (quality->write_).shared_alloc_.alloc;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  this_00 = local_80;
  local_90 = (quality->write_).shared_alloc_.direct_ptr;
  local_88 = mesh;
  local_78 = local_90;
  local_58 = pvVar2;
  local_48 = pvVar4;
  Mesh::globals((Mesh *)&local_40,(Int)mesh);
  local_70 = local_40;
  peStack_68 = local_38;
  if ((((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    local_40->use_count = local_40->use_count + -1;
    local_70 = (Alloc *)(local_40->size * 8 + 1);
  }
  this_01 = local_70;
  local_c0.write_.shared_alloc_.alloc = this_03;
  bVar5 = ((ulong)this_03 & 7) == 0;
  if (bVar5 && this_03 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.write_.shared_alloc_.alloc = (Alloc *)(this_03->size * 8 + 1);
    }
    else {
      this_03->use_count = this_03->use_count + 1;
    }
  }
  bVar6 = ((ulong)this_02 & 7) == 0;
  local_d0.write_.shared_alloc_.alloc = this_02;
  if (bVar6 && this_02 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0.write_.shared_alloc_.alloc = (Alloc *)(this_02->size * 8 + 1);
    }
    else {
      this_02->use_count = this_02->use_count + 1;
    }
  }
  local_e0.write_.shared_alloc_.alloc = (candidates->write_).shared_alloc_.alloc;
  if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0.write_.shared_alloc_.alloc =
           (Alloc *)((local_e0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_e0.write_.shared_alloc_.alloc)->use_count =
           (local_e0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_e0.write_.shared_alloc_.direct_ptr = (candidates->write_).shared_alloc_.direct_ptr;
  bVar7 = ((ulong)this_00 & 7) == 0;
  local_b0.quality.write_.shared_alloc_.alloc = this_00;
  if (bVar7 && this_00 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.quality.write_.shared_alloc_.alloc = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_b0.quality.write_.shared_alloc_.direct_ptr = local_90;
  bVar8 = local_70 != (Alloc *)0x0;
  bVar9 = ((ulong)local_70 & 7) == 0;
  local_b0.global.write_.shared_alloc_.alloc = local_70;
  if (bVar9 && bVar8) {
    if (entering_parallel == '\x01') {
      local_b0.global.write_.shared_alloc_.alloc = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_b0.global.write_.shared_alloc_.direct_ptr = local_38;
  local_d0.write_.shared_alloc_.direct_ptr = pvVar2;
  local_c0.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar10 = indset::find<Omega_h::QualityCompare>
                     ((indset *)this,local_88,ent_dim,&local_c0,&local_d0,&local_e0,&local_b0);
  pAVar3 = local_b0.global.write_.shared_alloc_.alloc;
  pvVar4 = RVar10.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_b0.global.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.global.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b0.global.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0.global.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar4 = extraout_RDX;
    }
  }
  pAVar3 = local_b0.quality.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.quality.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.quality.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b0.quality.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0.quality.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  pAVar3 = local_e0.write_.shared_alloc_.alloc;
  if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_e0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  pAVar3 = local_d0.write_.shared_alloc_.alloc;
  if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  pAVar3 = local_c0.write_.shared_alloc_.alloc;
  if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  if (bVar9 && bVar8) {
    piVar1 = &this_01->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
      pvVar4 = extraout_RDX_04;
    }
  }
  if (bVar7 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      pvVar4 = extraout_RDX_05;
    }
  }
  if (bVar6 && this_02 != (Alloc *)0x0) {
    piVar1 = &this_02->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_02);
      operator_delete(this_02,0x48);
      pvVar4 = extraout_RDX_06;
    }
  }
  if (bVar5 && this_03 != (Alloc *)0x0) {
    piVar1 = &this_03->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_03);
      operator_delete(this_03,0x48);
      pvVar4 = extraout_RDX_07;
    }
  }
  RVar10.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar10.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar10.write_.shared_alloc_;
}

Assistant:

Read<I8> find_indset(
    Mesh* mesh, Int ent_dim, Graph graph, Reals quality, Read<I8> candidates) {
  auto xadj = graph.a2ab;
  auto adj = graph.ab2b;
  QualityCompare compare;
  compare.quality = quality;
  compare.global = mesh->globals(ent_dim);
  return indset::find(mesh, ent_dim, xadj, adj, candidates, compare);
}